

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_short> * __thiscall
cimg_library::CImg<unsigned_short>::assign
          (CImg<unsigned_short> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulongT uVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  unsigned_short *puVar9;
  ulong uVar10;
  size_t curr_siz;
  size_t siz;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  CImg<unsigned_short> *this_local;
  
  uVar5 = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if (uVar5 == 0) {
    this_local = assign(this);
  }
  else {
    uVar6 = size(this);
    if (uVar5 != uVar6) {
      if ((this->_is_shared & 1U) != 0) {
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        uVar1 = this->_width;
        uVar2 = this->_height;
        uVar3 = this->_depth;
        uVar4 = this->_spectrum;
        puVar9 = this->_data;
        pcVar7 = "non-";
        if ((this->_is_shared & 1U) != 0) {
          pcVar7 = "";
        }
        pcVar8 = pixel_type();
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Invalid assignment request of shared instance from specified image (%u,%u,%u,%u)."
                   ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar9,pcVar7,pcVar8,size_x,
                   size_y,size_z,size_c);
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                    CImgArgumentException::~CImgArgumentException);
      }
      if (this->_data != (unsigned_short *)0x0) {
        operator_delete__(this->_data);
      }
      uVar10 = uVar5 * 2;
      if (CARRY8(uVar5,uVar5)) {
        uVar10 = 0xffffffffffffffff;
      }
      puVar9 = (unsigned_short *)operator_new__(uVar10);
      this->_data = puVar9;
    }
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    this_local = this;
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!siz) return assign();
      const size_t curr_siz = (size_t)size();
      if (siz!=curr_siz) {
	if (_is_shared)
          throw CImgArgumentException(_cimg_instance
                                      "assign(): Invalid assignment request of shared instance from specified "
                                      "image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      size_x,size_y,size_z,size_c);
	else {
          delete[] _data;
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                        size_x,size_y,size_z,size_c);
          }
        }
      }
      _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      return *this;
    }